

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectromagneticEmissionsPdu.cpp
# Opt level: O0

int __thiscall
DIS::ElectromagneticEmissionsPdu::getMarshalledSize(ElectromagneticEmissionsPdu *this)

{
  pointer pEVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer pEVar5;
  const_reference pvVar6;
  undefined1 local_70 [8];
  ElectromagneticEmissionSystemData listElement;
  unsigned_long_long idx;
  int marshalSize;
  ElectromagneticEmissionsPdu *this_local;
  
  iVar2 = DistributedEmissionsFamilyPdu::getMarshalledSize
                    (&this->super_DistributedEmissionsFamilyPdu);
  iVar3 = EntityID::getMarshalledSize(&this->_emittingEntityID);
  iVar4 = EventIdentifier::getMarshalledSize(&this->_eventID);
  idx._4_4_ = iVar2 + iVar3 + iVar4 + 4;
  listElement._beamDataRecords.
  super__Vector_base<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    pEVar1 = listElement._beamDataRecords.
             super__Vector_base<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pEVar5 = (pointer)std::
                      vector<DIS::ElectromagneticEmissionSystemData,_std::allocator<DIS::ElectromagneticEmissionSystemData>_>
                      ::size(&this->_systems);
    if (pEVar5 <= pEVar1) break;
    pvVar6 = std::
             vector<DIS::ElectromagneticEmissionSystemData,_std::allocator<DIS::ElectromagneticEmissionSystemData>_>
             ::operator[](&this->_systems,
                          (size_type)
                          listElement._beamDataRecords.
                          super__Vector_base<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ElectromagneticEmissionSystemData::ElectromagneticEmissionSystemData
              ((ElectromagneticEmissionSystemData *)local_70,pvVar6);
    iVar2 = ElectromagneticEmissionSystemData::getMarshalledSize
                      ((ElectromagneticEmissionSystemData *)local_70);
    idx._4_4_ = idx._4_4_ + iVar2;
    ElectromagneticEmissionSystemData::~ElectromagneticEmissionSystemData
              ((ElectromagneticEmissionSystemData *)local_70);
    listElement._beamDataRecords.
    super__Vector_base<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)&(listElement._beamDataRecords.
                           super__Vector_base<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                          _vptr_ElectromagneticEmissionBeamData + 1);
  }
  return idx._4_4_;
}

Assistant:

int ElectromagneticEmissionsPdu::getMarshalledSize() const
{
    int marshalSize = 0;

    marshalSize = DistributedEmissionsFamilyPdu::getMarshalledSize();
    marshalSize = marshalSize + _emittingEntityID.getMarshalledSize();  // _emittingEntityID
    marshalSize = marshalSize + _eventID.getMarshalledSize();  // _eventID
    marshalSize = marshalSize + 1;  // _stateUpdateIndicator
    marshalSize = marshalSize + 1;  // _numberOfSystems
    marshalSize = marshalSize + 2;  // _paddingForEmissionsPdu    

    for(unsigned long long idx=0; idx < _systems.size(); idx++)
    {
        ElectromagneticEmissionSystemData listElement = _systems[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}